

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubRoutineLocMixWithImplicit::Run(SubRoutineLocMixWithImplicit *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  DefOccurence local_53c;
  LayoutSpecifierBase local_538;
  LayoutSpecifierBase local_528;
  SubroutineUniform local_518;
  LayoutSpecifierBase local_3b0;
  DefOccurence local_39c;
  LayoutSpecifierBase local_398;
  LayoutSpecifierBase local_388;
  SubroutineUniform local_378;
  LayoutSpecifierBase local_210;
  DefOccurence local_1fc;
  LayoutSpecifierBase local_1f8;
  LayoutSpecifierBase local_1d8;
  SubroutineUniform local_1c8;
  undefined1 local_60 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  SubRoutineLocMixWithImplicit *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,generator,2);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_60);
  local_1f8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_1d8 = local_1f8;
  DefOccurence::DefOccurence(&local_1fc,ALL_SH);
  local_210 = local_1d8;
  SubroutineUniform::SubroutineUniform
            (&local_1c8,generator,
             (SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Loc)local_1d8,0,local_1fc,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_60,&local_1c8);
  SubroutineUniform::~SubroutineUniform(&local_1c8);
  local_398 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,Dec);
  local_388 = local_398;
  DefOccurence::DefOccurence(&local_39c,ALL_SH);
  local_3b0 = local_388;
  SubroutineUniform::SubroutineUniform
            (&local_378,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Loc)local_388,0,local_39c,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_60,&local_378);
  SubroutineUniform::~SubroutineUniform(&local_378);
  local_538 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,Dec);
  local_528 = local_538;
  DefOccurence::DefOccurence(&local_53c,ALL_SH);
  SubroutineUniform::SubroutineUniform
            (&local_518,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Loc)local_528,0,local_53c,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_60,&local_518);
  SubroutineUniform::~SubroutineUniform(&local_518);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_60);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_60);
  SubroutineFunctionSet::~SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;
		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit()));
		//layout(location = 1 ) subroutine uniform st0 u1;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(0)));
		//layout(location = 0 ) subroutine uniform st0 u2;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1)));

		return doRun(subroutineUniforms);
	}